

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_lu.cc
# Opt level: O1

int X509_STORE_CTX_get_by_subject(X509_STORE_CTX *vs,int type,X509_NAME *name,X509_OBJECT *ret)

{
  X509_STORE *pXVar1;
  OPENSSL_STACK *sk;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  int *piVar5;
  size_t sVar6;
  long *plVar7;
  size_t sVar8;
  int *piVar9;
  X509_OBJECT stmp;
  int local_40 [4];
  
  pXVar1 = vs->ctx;
  CRYPTO_MUTEX_lock_write(&pXVar1->objs_lock);
  sk = (OPENSSL_STACK *)pXVar1->objs;
  piVar5 = (int *)0x0;
  iVar4 = x509_object_idx_cnt((stack_st_X509_OBJECT *)sk,type,name,(int *)0x0);
  if (iVar4 != -1) {
    piVar5 = (int *)OPENSSL_sk_value(sk,(long)iVar4);
  }
  CRYPTO_MUTEX_unlock_write(&pXVar1->objs_lock);
  piVar9 = piVar5;
  if (type == 2 || piVar5 == (int *)0x0) {
    sVar6 = OPENSSL_sk_num((OPENSSL_STACK *)pXVar1->get_cert_methods);
    if (sVar6 != 0) {
      sVar6 = 0;
      do {
        plVar7 = (long *)OPENSSL_sk_value((OPENSSL_STACK *)pXVar1->get_cert_methods,sVar6);
        bVar3 = true;
        if ((*plVar7 != 0) && (pcVar2 = *(code **)(*plVar7 + 0x18), pcVar2 != (code *)0x0)) {
          iVar4 = (*pcVar2)(plVar7,type,name,local_40);
          bVar3 = iVar4 < 1;
        }
        piVar9 = local_40;
        if (!bVar3) break;
        sVar6 = sVar6 + 1;
        sVar8 = OPENSSL_sk_num((OPENSSL_STACK *)pXVar1->get_cert_methods);
        piVar9 = piVar5;
      } while (sVar6 < sVar8);
    }
    if (piVar9 == (int *)0x0) {
      return 0;
    }
  }
  ret->type = *piVar9;
  ret->data = *(anon_union_8_4_ca12f507_for_data *)(piVar9 + 2);
  X509_OBJECT_up_ref_count((X509_OBJECT *)ret);
  return 1;
}

Assistant:

int X509_STORE_CTX_get_by_subject(X509_STORE_CTX *vs, int type, X509_NAME *name,
                                  X509_OBJECT *ret) {
  X509_STORE *ctx = vs->ctx;
  X509_OBJECT stmp;
  CRYPTO_MUTEX_lock_write(&ctx->objs_lock);
  X509_OBJECT *tmp = X509_OBJECT_retrieve_by_subject(ctx->objs, type, name);
  CRYPTO_MUTEX_unlock_write(&ctx->objs_lock);

  if (tmp == NULL || type == X509_LU_CRL) {
    for (size_t i = 0; i < sk_X509_LOOKUP_num(ctx->get_cert_methods); i++) {
      X509_LOOKUP *lu = sk_X509_LOOKUP_value(ctx->get_cert_methods, i);
      if (X509_LOOKUP_by_subject(lu, type, name, &stmp)) {
        tmp = &stmp;
        break;
      }
    }
    if (tmp == NULL) {
      return 0;
    }
  }

  // TODO(crbug.com/boringssl/685): This should call
  // |X509_OBJECT_free_contents|.
  ret->type = tmp->type;
  ret->data = tmp->data;
  X509_OBJECT_up_ref_count(ret);
  return 1;
}